

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O2

string_view __thiscall
libtorrent::bdecode_node::dict_find_string_value
          (bdecode_node *this,string_view key,string_view default_value)

{
  bdecode_node n;
  bdecode_node bStack_58;
  
  dict_find(&bStack_58,this,key);
  if (((long)bStack_58.m_token_idx != -1) &&
     (((ulong)bStack_58.m_root_tokens[bStack_58.m_token_idx] & 0xe0000000) == 0x60000000)) {
    default_value = string_value(&bStack_58);
  }
  std::
  _Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
  ::~_Vector_base((_Vector_base<libtorrent::detail::bdecode_token,_std::allocator<libtorrent::detail::bdecode_token>_>
                   *)&bStack_58);
  return default_value;
}

Assistant:

string_view bdecode_node::dict_find_string_value(string_view key
		, string_view default_value) const
	{
		bdecode_node n = dict_find(key);
		if (n.type() != bdecode_node::string_t) return default_value;
		return n.string_value();
	}